

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackGenerator::StoreOption<char_const*>(cmCPackGenerator *this,string *op,char *value)

{
  cmCPackLog *this_00;
  cmMakefile *this_01;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  char *msg;
  string_view local_1d8;
  string local_1c8 [48];
  undefined1 local_198 [8];
  ostringstream cmCPackLog_msg;
  char *value_local;
  string *op_local;
  cmCPackGenerator *this_local;
  
  if (value == (char *)0x0) {
    cmMakefile::RemoveDefinition(this->MakefileMap,op);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    iVar1 = (**this->_vptr_cmCPackGenerator)();
    poVar2 = std::operator<<((ostream *)local_198,(char *)CONCAT44(extraout_var,iVar1));
    poVar2 = std::operator<<(poVar2,"::SetOption(");
    poVar2 = std::operator<<(poVar2,(string *)op);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,value);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = this->Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3fe,msg);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    this_01 = this->MakefileMap;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,value);
    cmMakefile::AddDefinition(this_01,op,local_1d8);
  }
  return;
}

Assistant:

void cmCPackGenerator::StoreOption(const std::string& op, ValueType value)
{
  if (!value) {
    this->MakefileMap->RemoveDefinition(op);
    return;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                this->GetNameOfClass() << "::SetOption(" << op << ", " << value
                                       << ")" << std::endl);
  this->MakefileMap->AddDefinition(op, value);
}